

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superstep.hpp
# Opt level: O2

void __thiscall
Superstep<int>::workerFunction
          (Superstep<int> *this,int index,vector<int,_std::allocator<int>_> *inputItems,
          vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_> *outputItems)

{
  int *piVar1;
  iterator iVar2;
  ulong uVar3;
  size_t sVar4;
  int *piVar5;
  iterator it;
  int i;
  list<int,_std::allocator<int>_> remainingActivities;
  CommunicationProtocols protocols;
  shared_ptr<LockedVector<int>_> targetV;
  
  Barrier::waitForFinish(&this->startBarrier);
  std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>::operator()
            (&(this->activitiesFunctions).
              super__Vector_base<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[index].first,index,inputItems);
  Barrier::decreaseBarrier(&this->compPhaseBarrier);
  std::
  function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>
  ::operator()(&protocols,
               &(this->activitiesFunctions).
                super__Vector_base<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[index].second,index,inputItems);
  if (protocols.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      protocols.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)&remainingActivities,&this->outputVectorsMutex);
    uVar3 = ((long)protocols.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)protocols.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x18;
    if ((ulong)(((long)(outputItems->
                       super__Vector_base<LockableVector<int>,_std::allocator<LockableVector<int>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(outputItems->
                      super__Vector_base<LockableVector<int>,_std::allocator<LockableVector<int>_>_>
                      )._M_impl.super__Vector_impl_data._M_start) / 0x70) < uVar3) {
      std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>::resize
                (outputItems,uVar3);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&remainingActivities);
    std::__cxx11::list<int,_std::allocator<int>_>::list
              (&remainingActivities,
               ((long)protocols.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)protocols.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)&targetV);
    std::iota<std::_List_iterator<int>,int>
              ((_List_iterator<int>)
               remainingActivities.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
               super__List_node_base._M_next,(_List_node_base *)&remainingActivities,0);
    LOCK();
    UNLOCK();
    uVar3 = (ulong)(long)(int)nextVectorToLock.super___atomic_base<int>._M_i %
            remainingActivities.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
    sVar4 = 1;
    nextVectorToLock.super___atomic_base<int>._M_i =
         (__atomic_base<int>)
         (__atomic_base<int>)(nextVectorToLock.super___atomic_base<int>._M_i + 1)._M_i;
    while (sVar4 != 0) {
      it._M_node = remainingActivities.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                   super__List_node_base._M_next;
      std::advance<std::_List_iterator<int>,int>(&it,(int)uVar3);
      while (iVar2._M_node = it._M_node, it._M_node != (_List_node_base *)&remainingActivities) {
        if (protocols.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[*(int *)&it._M_node[1]._M_next].
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
            == protocols.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[*(int *)&it._M_node[1]._M_next].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start) {
          it._M_node = (it._M_node)->_M_next;
          std::__cxx11::list<int,_std::allocator<int>_>::erase
                    (&remainingActivities,(const_iterator)iVar2._M_node);
        }
        else {
          LockableVector<int>::tryLockAndGet((LockableVector<int> *)&targetV);
          piVar1 = protocols.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[*(int *)&it._M_node[1]._M_next].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish;
          for (piVar5 = protocols.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[*(int *)&it._M_node[1]._M_next].
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start; iVar2._M_node = it._M_node,
              piVar5 != piVar1; piVar5 = piVar5 + 1) {
            i = *piVar5;
            std::vector<int,std::allocator<int>>::emplace_back<int&>
                      ((vector<int,std::allocator<int>> *)
                       (targetV.super___shared_ptr<LockedVector<int>,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->data,&i);
          }
          it._M_node = (it._M_node)->_M_next;
          std::__cxx11::list<int,_std::allocator<int>_>::erase
                    (&remainingActivities,(const_iterator)iVar2._M_node);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&targetV.super___shared_ptr<LockedVector<int>,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
      }
      uVar3 = 0;
      sVar4 = remainingActivities.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
              _M_size;
    }
    std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
              (&remainingActivities.super__List_base<int,_std::allocator<int>_>);
  }
  Barrier::decreaseBarrier(&this->commPhaseBarrier);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&protocols);
  return;
}

Assistant:

void Superstep<T>::workerFunction (int index, std::vector<T> &inputItems, std::vector<LockableVector<T>> &outputItems) {
	startBarrier.waitForFinish ();


	
	// ============================
	// Performing computation phase
	activitiesFunctions[index].first (index, inputItems);
	compPhaseBarrier.decreaseBarrier ();



	// ==============================
	// Performing communication phase
	// Computing vector which defines the communication phase
	CommunicationProtocols protocols	= activitiesFunctions[index].second (index, std::ref(inputItems));

	if (protocols.size() != 0) {
		// Checking if a resize of outputvectors is needed
		{
			std::unique_lock<std::mutex> lock (outputVectorsMutex);
			
			if (protocols.size() > outputItems.size()) {
				outputItems.resize (protocols.size ());
			}
		}

		std::list<int> remainingActivities (protocols.size());
		int idx	= 0;
		std::iota (std::begin(remainingActivities), std::end(remainingActivities), idx++);


		int vectorOffset	= (nextVectorToLock++) % remainingActivities.size();
		while (remainingActivities.size() > 0) {
			auto it	= std::begin (remainingActivities);
			std::advance (it, vectorOffset);

			while (it!=remainingActivities.end()) {

				if (protocols[*it].size() == 0) {
					remainingActivities.erase (it++);
				}
				else {
					try {
						std::shared_ptr<LockedVector<T>> targetV	= outputItems[*it].tryLockAndGet();
						auto &targetProtocol						= protocols[*it];
						
						// Inserting data at the end of target vector
						for (auto i : targetProtocol) {
							targetV->data.emplace_back (i);
						}

						remainingActivities.erase (it++);
					} catch (std::logic_error &e) {
						it++;
					}
				}
			}
			vectorOffset	= 0;
		}
	}

	outputItems.shrink_to_fit ();

	commPhaseBarrier.decreaseBarrier ();
}